

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O3

int output_instructions(Function *fn,InstructionList *list)

{
  TextBuffer *mb;
  TextBuffer *mb_00;
  char cVar1;
  long lVar2;
  C_MemoryAllocator *pCVar3;
  int *piVar4;
  byte bVar5;
  uint uVar6;
  Instruction *insn;
  Pseudo *pPVar7;
  LinearizerState *pLVar8;
  uint *puVar9;
  SymbolType *pSVar10;
  void *pvVar11;
  undefined8 uVar12;
  C_Scope *pCVar13;
  C_Token *pCVar14;
  C_Obj *pCVar15;
  char *pcVar16;
  Pseudo *pPVar17;
  Pseudo *pPVar18;
  int *piVar19;
  C_Node *node;
  void *pvVar20;
  Ravi_CompilerInterface *pRVar21;
  ProcList *pPVar22;
  Proc *pPVar23;
  ulong uVar24;
  uint uVar25;
  int iVar26;
  char *pcVar27;
  PseudoList *list_00;
  SymbolType SVar28;
  int *piVar29;
  uint uVar30;
  char *pcVar31;
  bool bVar32;
  bool bVar33;
  C_Code_Analysis analysis;
  TextBuffer canned_code;
  C_MemoryAllocator allocator;
  TextBuffer saved;
  PtrListIterator insniter__;
  Pseudo src;
  C_Code_Analysis local_26c;
  char *local_268;
  char *local_260;
  char *local_258;
  TextBuffer local_250;
  undefined1 local_238 [80];
  TextBuffer local_1e8;
  PtrListIterator local_1d0;
  undefined1 local_1b8 [368];
  char *local_48;
  _Bool local_40;
  
  raviX_ptrlist_forward_iterator(&local_1d0,(PtrList *)list);
  insn = (Instruction *)raviX_ptrlist_iter_next(&local_1d0);
  if (insn != (Instruction *)0x0) {
    mb = &fn->body;
    do {
      (fn->tb).pos = 0;
      raviX_output_instruction(insn,&fn->tb);
      raviX_buffer_add_fstring(mb,"// %s\n",(fn->tb).buf);
      (fn->tb).pos = 0;
      cVar1 = *(char *)insn;
      switch(cVar1) {
      case '\x01':
        iVar26 = raviX_ptrlist_size((PtrList *)fn->proc->procs);
        if (0 < iVar26) {
          raviX_buffer_add_string(mb,"{\nluaF_close(L, base, LUA_OK);\n");
          raviX_buffer_add_string(mb,"base = ci->u.l.base;\n");
          raviX_buffer_add_string(mb,"}\n");
        }
        raviX_buffer_add_string(mb,"{\n");
        raviX_buffer_add_string(mb," TValue *stackbase = ci->func;\n");
        raviX_buffer_add_string(mb," int wanted = ci->nresults;\n");
        raviX_buffer_add_string(mb," result = wanted == -1 ? 0 : 1;\n");
        uVar25 = raviX_ptrlist_size((PtrList *)insn->operands);
        if ((int)uVar25 < 1) {
          pcVar16 = " int available = 0;\n";
LAB_00120d05:
          raviX_buffer_add_string(mb,pcVar16);
        }
        else {
          pSVar10 = (SymbolType *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,uVar25 - 1);
          if ((*pSVar10 & 0xf) == 0xb) {
            raviX_buffer_add_string(mb," int available = 0;\n");
            raviX_buffer_add_string(mb," {\n");
            raviX_buffer_add_string(mb,"  TValue *start_vararg = ");
            local_1b8._32_8_ = (Pseudo *)0x0;
            local_1b8._40_8_ = (Pseudo *)0x0;
            local_1b8._4_4_ = 0;
            local_1b8._8_4_ = 0;
            local_1b8._12_4_ = ~RAVI_TANY;
            local_1b8._16_8_ = 0;
            local_1b8._24_8_ = 0;
            local_1b8._0_4_ = *pSVar10 & 0xffff0 | SYM_ENV;
            emit_reg_accessor(fn,(Pseudo *)local_1b8,0);
            raviX_buffer_add_string(mb," ;\n");
            raviX_buffer_add_fstring
                      (mb,"  available = (L->top - start_vararg) + %d;\n",(ulong)(uVar25 - 1));
            pcVar16 = " }\n";
            goto LAB_00120d05;
          }
          raviX_buffer_add_fstring(mb," int available = %d;\n",(ulong)uVar25);
        }
        raviX_buffer_add_string(mb," if (wanted == -1) wanted = available;\n");
        raviX_buffer_add_string(mb," int j = 0;\n");
        raviX_ptrlist_forward_iterator((PtrListIterator *)local_238,(PtrList *)insn->operands);
        pPVar17 = (Pseudo *)raviX_ptrlist_iter_next((PtrListIterator *)local_238);
        if (pPVar17 != (Pseudo *)0x0) {
          uVar24 = 0;
          do {
            if (((undefined1  [48])*pPVar17 & (undefined1  [48])0xf) == (undefined1  [48])0xb) {
              uVar25 = compute_register_from_base(fn,pPVar17);
              raviX_buffer_add_fstring(mb," {\n int reg = %d;\n",(ulong)uVar25);
              raviX_buffer_add_string(mb,"  while (j < available) {\n");
              raviX_buffer_add_string(mb,"   TValue *dest_reg = S(j);\n");
              raviX_buffer_add_string(mb,"   TValue *src_reg = R(reg);\n");
              raviX_buffer_add_string
                        (mb,
                         "   dest_reg->tt_ = src_reg->tt_; dest_reg->value_.gc = src_reg->value_.gc;\n"
                        );
              raviX_buffer_add_string(mb,"   j++, reg++;\n");
              raviX_buffer_add_string(mb,"  }\n");
              raviX_buffer_add_string(mb," }\n");
            }
            else {
              local_1b8._4_4_ = 0;
              local_1b8._12_4_ = ~RAVI_TANY;
              local_1b8._16_8_ = 0;
              local_1b8._24_8_ = 0;
              local_1b8._32_8_ = (Pseudo *)0x0;
              local_1b8._40_8_ = (Pseudo *)0x0;
              local_1b8._0_4_ = 0xd;
              local_1b8._8_4_ = (uint)uVar24;
              raviX_buffer_add_fstring(mb," if (%d < available) {\n",uVar24);
              emit_move(fn,pPVar17,(Pseudo *)local_1b8);
              raviX_buffer_add_string(mb," }\n");
              raviX_buffer_add_fstring(mb," j++;\n");
              uVar24 = (ulong)((uint)uVar24 + 1);
            }
            pPVar17 = (Pseudo *)raviX_ptrlist_iter_next((PtrListIterator *)local_238);
          } while (pPVar17 != (Pseudo *)0x0);
        }
        raviX_buffer_add_string(mb," while (j < wanted) {\n");
        raviX_buffer_add_string(mb,"  setnilvalue(S(j));\n");
        raviX_buffer_add_string(mb,"  j++;\n");
        raviX_buffer_add_string(mb," }\n");
        raviX_buffer_add_string(mb," L->top = S(0) + wanted;\n");
        raviX_buffer_add_string(mb," L->ci = ci->previous;\n");
        raviX_buffer_add_string(mb,"}\n");
        pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
        emit_jump(fn,pPVar17);
        goto LAB_001216b8;
      case '\x02':
      case '\x06':
      case '\v':
        raviX_buffer_add_string(mb,"{\n");
        pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
        raviX_buffer_add_string(mb," TValue *ra = ");
        emit_reg_accessor(fn,pPVar17,0);
        raviX_buffer_add_string(mb,";\n");
        cVar1 = *(char *)insn;
        if (cVar1 == '\x02') {
          pcVar27 = "TM_ADD";
          pcVar16 = "+";
        }
        else if (cVar1 == '\v') {
          pcVar27 = "TM_MUL";
          pcVar16 = "*";
        }
        else {
          if (cVar1 != '\x06') {
            pcVar16 = "Unexpected opcode";
            goto LAB_0012186b;
          }
          pcVar27 = "TM_SUB";
          pcVar16 = "-";
        }
        raviX_buffer_add_string(mb," TValue *rb = ");
        pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
        emit_reg_accessor(fn,pPVar17,0);
        raviX_buffer_add_string(mb,";\n");
        raviX_buffer_add_string(mb," TValue *rc = ");
        pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,1);
        emit_reg_accessor(fn,pPVar17,0);
        raviX_buffer_add_string(mb,";\n");
        raviX_buffer_add_string(mb," lua_Integer i = 0;\n");
        raviX_buffer_add_string(mb," lua_Integer ic = 0;\n");
        raviX_buffer_add_string(mb," lua_Number n = 0.0;\n");
        raviX_buffer_add_string(mb," lua_Number nc = 0.0;\n");
        raviX_buffer_add_string(mb," if (ttisinteger(rb) && ttisinteger(rc)) {\n");
        raviX_buffer_add_string(mb,"  i = ivalue(rb);\n");
        raviX_buffer_add_string(mb,"  ic = ivalue(rc);\n");
        raviX_buffer_add_fstring(mb,"  setivalue(ra, (i %s ic));\n",pcVar16);
        raviX_buffer_add_string(mb," } else if (tonumberns(rb, n) && tonumberns(rc, nc)) {\n");
        raviX_buffer_add_fstring(mb,"  setfltvalue(ra, (n %s nc));\n",pcVar16);
        raviX_buffer_add_string(mb," } else {\n");
        raviX_buffer_add_fstring(mb,"  luaT_trybinTM(L, rb, rc, ra, %s);\n",pcVar27);
        raviX_buffer_add_string(mb,"  base = ci->u.l.base;\n");
        pcVar16 = " }\n";
        goto LAB_0012169c;
      case '\x03':
      case '\x05':
      case '\a':
      case '\n':
      case '\f':
      case '\x0e':
      case '\x10':
      case '\x13':
      case '\x16':
      case '\x18':
      case '\x1a':
        raviX_buffer_add_string(mb,"{ ");
        pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
        if ((*(uint *)pPVar17 & 0xf) - 1 < 3) {
          emit_varname(fn,pPVar17);
          pcVar16 = " = ";
        }
        else {
          raviX_buffer_add_string(mb,"TValue *dst_reg = ");
          emit_reg_accessor(fn,pPVar17,0);
          if ((*(byte *)insn < 0x11) && ((0x11088U >> (*(byte *)insn & 0x1f) & 1) != 0)) {
            pcVar16 = "; setfltvalue(dst_reg, ";
          }
          else {
            pcVar16 = "; setivalue(dst_reg, ";
          }
        }
        raviX_buffer_add_string(mb,pcVar16);
        bVar5 = *(char *)insn - 3;
        if ((0x17 < bVar5) || ((0xa92a95U >> (bVar5 & 0x1f) & 1) == 0)) {
switchD_0011e800_caseD_31:
          pRVar21 = fn->api;
          pcVar16 = "Unexpected opcode";
LAB_0012175c:
          (*pRVar21->error_message)(pRVar21->context,pcVar16);
          longjmp((__jmp_buf_tag *)fn->env,1);
        }
        iVar26 = *(int *)(&DAT_0013f460 + (ulong)bVar5 * 4);
        pPVar18 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
        emit_varname_or_constant(fn,pPVar18);
        raviX_buffer_add_fstring(mb," %s ",&DAT_0013f460 + iVar26);
        pPVar18 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,1);
        emit_varname_or_constant(fn,pPVar18);
        uVar25 = *(uint *)pPVar17;
        pcVar16 = "); }\n";
        pcVar27 = "; }\n";
        goto LAB_0011e8ef;
      case '\x04':
      case '\b':
      case '\r':
      case '\x11':
        raviX_buffer_add_string(mb,"{ ");
        pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
        if (((undefined1  [48])*pPVar17 & (undefined1  [48])0xf) == (undefined1  [48])0x1) {
          emit_varname(fn,pPVar17);
          pcVar16 = " = ";
        }
        else {
          raviX_buffer_add_string(mb,"TValue *dst_reg = ");
          emit_reg_accessor(fn,pPVar17,0);
          pcVar16 = "; setfltvalue(dst_reg, ";
        }
        raviX_buffer_add_string(mb,pcVar16);
        bVar5 = *(byte *)insn;
        if (bVar5 < 0xd) {
          if (bVar5 == 4) {
            pcVar16 = "+";
          }
          else {
            if (bVar5 != 8) goto switchD_0011e800_caseD_31;
            pcVar16 = "-";
          }
        }
        else if (bVar5 == 0xd) {
          pcVar16 = "*";
        }
        else {
          if (bVar5 != 0x11) goto switchD_0011e800_caseD_31;
          pcVar16 = "/";
        }
        pPVar18 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
        emit_varname_or_constant(fn,pPVar18);
        raviX_buffer_add_fstring(mb," %s ((lua_Number)(",pcVar16);
        pPVar18 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,1);
        emit_varname_or_constant(fn,pPVar18);
        raviX_buffer_add_string(mb,"))");
        goto LAB_0012082e;
      case '\t':
      case '\x12':
        raviX_buffer_add_string(mb,"{ ");
        pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
        if (((undefined1  [48])*pPVar17 & (undefined1  [48])0xf) == (undefined1  [48])0x1) {
          emit_varname(fn,pPVar17);
          pcVar16 = " = ";
        }
        else {
          raviX_buffer_add_string(mb,"TValue *dst_reg = ");
          emit_reg_accessor(fn,pPVar17,0);
          pcVar16 = "; setfltvalue(dst_reg, ";
        }
        raviX_buffer_add_string(mb,pcVar16);
        if (*(char *)insn == '\t') {
          pcVar16 = "-";
        }
        else {
          if (*(char *)insn != '\x12') goto switchD_0011e800_caseD_31;
          pcVar16 = "/";
        }
        raviX_buffer_add_string(mb,"((lua_Number)(");
        pPVar18 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
        emit_varname_or_constant(fn,pPVar18);
        raviX_buffer_add_fstring(mb,")) %s ",pcVar16);
        pPVar18 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,1);
        emit_varname_or_constant(fn,pPVar18);
LAB_0012082e:
        bVar33 = ((undefined1  [48])*pPVar17 & (undefined1  [48])0xf) == (undefined1  [48])0x1;
LAB_00120837:
        pcVar16 = "); }\n";
        if (bVar33) {
          pcVar16 = "; }\n";
        }
        goto LAB_00120c68;
      case '\x0f':
        uVar12 = 5;
        break;
      case '\x14':
        uVar12 = 6;
        break;
      case '\x15':
        uVar12 = 7;
        break;
      case '\x17':
        uVar12 = 8;
        break;
      case '\x19':
        uVar12 = 9;
        break;
      case '\x1b':
        uVar12 = 10;
        break;
      case '\x1c':
      case '\x1e':
        raviX_buffer_add_string(mb,"{\n ");
        pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
        if ((*(uint *)pPVar17 & 0xf) - 1 < 3) {
          emit_varname(fn,pPVar17);
          pcVar16 = " = ";
        }
        else {
          raviX_buffer_add_string(mb,"TValue *dst_reg = ");
          emit_reg_accessor(fn,pPVar17,0);
          pcVar16 = "; setivalue(dst_reg, ";
        }
        raviX_buffer_add_string(mb,pcVar16);
        raviX_buffer_add_string(mb,"luaV_shiftl(");
        pPVar18 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
        emit_varname_or_constant(fn,pPVar18);
        if (*(char *)insn == '\x1c') {
          pcVar16 = ", ";
        }
        else {
          if (*(char *)insn != '\x1e') goto switchD_0011e800_caseD_31;
          pcVar16 = ", -";
        }
        raviX_buffer_add_string(mb,pcVar16);
        pPVar18 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,1);
        emit_varname_or_constant(fn,pPVar18);
        raviX_buffer_add_string(mb,")");
        uVar25 = *(uint *)pPVar17;
        pcVar16 = ");\n}\n";
        pcVar27 = ";\n}\n";
LAB_0011e8ef:
        if ((uVar25 & 0xf) - 1 < 3) {
          pcVar16 = pcVar27;
        }
        goto LAB_00120c68;
      case '\x1d':
        uVar12 = 0xb;
        break;
      case '\x1f':
      case '\"':
      case '%':
        pcVar16 = "==";
        pcVar27 = "luaV_lessequal";
        if (cVar1 == '%') {
          pcVar16 = "<=";
        }
        if (cVar1 == '\"') {
          pcVar27 = "luaV_lessthan";
          pcVar16 = "<";
        }
        pcVar31 = "luaV_equalobj";
        if (cVar1 != '\x1f') {
          pcVar31 = pcVar27;
        }
        raviX_buffer_add_string(mb,"{\n int result = 0;\n");
        raviX_buffer_add_string(mb," TValue *rb = ");
        pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
        emit_reg_accessor(fn,pPVar17,0);
        raviX_buffer_add_string(mb,";\n TValue *rc = ");
        pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,1);
        emit_reg_accessor(fn,pPVar17,1);
        raviX_buffer_add_string(mb,";\n");
        raviX_buffer_add_string(mb," if (ttisinteger(rb) && ttisinteger(rc))\n");
        raviX_buffer_add_fstring(mb,"  result = (ivalue(rb) %s ivalue(rc));\n",pcVar16);
        raviX_buffer_add_string(mb," else {\n");
        raviX_buffer_add_fstring(mb,"  result = %s(L, rb, rc);\n  ",pcVar31);
        raviX_buffer_add_string(mb,"base = ci->u.l.base;\n");
        raviX_buffer_add_string(mb," }\n");
        pPVar17 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->targets);
        if ((*(uint *)pPVar17 & 0xf) == 3) {
          raviX_buffer_add_string(mb," ");
          emit_varname(fn,pPVar17);
          pcVar16 = " = result != 0;\n";
        }
        else {
          if ((*(uint *)pPVar17 & 0xf) != 4) {
            pcVar16 = "Unexpected pseudo";
            goto LAB_001217cf;
          }
          raviX_buffer_add_string(mb," setbvalue(");
          emit_reg_accessor(fn,pPVar17,0);
          pcVar16 = ", result != 0);\n";
        }
        goto LAB_00120c59;
      case ' ':
      case '!':
      case '#':
      case '$':
      case '&':
      case '\'':
        raviX_buffer_add_string(mb,"{ ");
        pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
        if (((undefined1  [48])*pPVar17 & (undefined1  [48])0xf) == (undefined1  [48])0x3) {
          emit_varname(fn,pPVar17);
          pcVar16 = " = ";
        }
        else {
          raviX_buffer_add_string(mb,"TValue *dst_reg = ");
          emit_reg_accessor(fn,pPVar17,0);
          pcVar16 = "; setbvalue(dst_reg, ";
        }
        raviX_buffer_add_string(mb,pcVar16);
        bVar5 = *(char *)insn - 0x20;
        if ((7 < bVar5) || ((0xdbU >> (bVar5 & 0x1f) & 1) == 0)) goto switchD_0011e800_caseD_31;
        iVar26 = *(int *)(&DAT_0013f4c0 + (ulong)bVar5 * 4);
        pPVar18 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
        emit_varname_or_constant(fn,pPVar18);
        raviX_buffer_add_fstring(mb," %s ",&DAT_0013f4c0 + iVar26);
        pPVar18 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,1);
        emit_varname_or_constant(fn,pPVar18);
        bVar33 = ((undefined1  [48])*pPVar17 & (undefined1  [48])0xf) == (undefined1  [48])0x3;
        goto LAB_00120837;
      case '(':
        uVar12 = 3;
        break;
      case ')':
        uVar12 = 4;
        break;
      case '*':
        puVar9 = (uint *)raviX_ptrlist_first((PtrList *)insn->operands);
        pPVar17 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->targets);
        if ((*puVar9 & 0xf) != 6) {
          __assert_fail("closure_pseudo->type == PSEUDO_PROC",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/codegen.c"
                        ,0x837,"int emit_op_closure(Function *, Instruction *)");
        }
        pvVar20 = *(void **)(puVar9 + 2);
        raviX_ptrlist_forward_iterator
                  ((PtrListIterator *)local_1b8,
                   *(PtrList **)(*(long *)((long)pvVar20 + 0x28) + 0x20));
        pvVar11 = raviX_ptrlist_iter_next((PtrListIterator *)local_1b8);
        if (pvVar11 == (void *)0x0) {
LAB_00121773:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/codegen.c"
                        ,0x848,"int emit_op_closure(Function *, Instruction *)");
        }
        uVar24 = 0;
        while (*(int *)((long)pvVar11 + 0x10) != *(int *)((long)pvVar20 + 0x10)) {
          uVar24 = (ulong)((int)uVar24 + 1);
          pvVar11 = raviX_ptrlist_iter_next((PtrListIterator *)local_1b8);
          if (pvVar11 == (void *)0x0) goto LAB_00121773;
        }
        if (pvVar11 != pvVar20) {
          __assert_fail("cursor == proc",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/codegen.c"
                        ,0x840,"int emit_op_closure(Function *, Instruction *)");
        }
        uVar25 = compute_register_from_base(fn,pPVar17);
        raviX_buffer_add_fstring(mb,"raviV_op_closure(L, ci, cl, %d, %d);\n",(ulong)uVar25,uVar24);
        pcVar16 = "base = ci->u.l.base;\n";
        goto LAB_00120c68;
      case '+':
        pPVar17 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->targets);
        pPVar18 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->operands);
        raviX_buffer_add_string(mb,"{\n");
        raviX_buffer_add_string(mb," lua_Number n = 0.0;\n");
        raviX_buffer_add_string(mb," TValue *rb = ");
        emit_reg_accessor(fn,pPVar18,0);
        raviX_buffer_add_string(mb,";\n");
        raviX_buffer_add_string(mb," TValue *ra = ");
        emit_reg_accessor(fn,pPVar17,0);
        raviX_buffer_add_string(mb,";\n");
        raviX_buffer_add_string(mb," if (ttisinteger(rb)) {\n");
        raviX_buffer_add_string(mb,"  lua_Integer i = ivalue(rb);\n");
        raviX_buffer_add_string(mb,"  setivalue(ra, intop(-, 0, i));\n");
        raviX_buffer_add_string(mb," } else if (tonumberns(rb, n)) {\n");
        raviX_buffer_add_string(mb,"  setfltvalue(ra, luai_numunm(L, n));\n");
        raviX_buffer_add_string(mb," } else {\n");
        raviX_buffer_add_string(mb,"  luaT_trybinTM(L, rb, rb, ra, TM_UNM);\n");
        pcVar16 = "base = ci->u.l.base;\n";
        goto LAB_00120354;
      case ',':
      case '-':
        pPVar17 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->targets);
        pPVar18 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->operands);
        pcVar16 = "setfltvalue";
        pcVar27 = "setfltvalue";
        if (*(char *)insn == ',') {
          pcVar16 = "setivalue";
          pcVar27 = "setivalue";
        }
        uVar25 = (*(char *)insn == ',') + 1;
        raviX_buffer_add_string(mb,"{\n");
        if ((*(uint *)pPVar18 & 0xf) != 5 && (*(uint *)pPVar18 & 0xf) != uVar25) {
          raviX_buffer_add_string(mb," TValue *rb = ");
          emit_reg_accessor(fn,pPVar18,0);
          raviX_buffer_add_string(mb,";\n");
        }
        uVar6 = *(uint *)pPVar17 & 0xf;
        if (uVar6 == uVar25) {
          raviX_buffer_add_string(mb," ");
          emit_varname(fn,pPVar17);
          raviX_buffer_add_string(mb," = -");
          if ((*(uint *)pPVar18 & 0xf) == 5 || (*(uint *)pPVar18 & 0xf) == uVar25) {
            emit_varname_or_constant(fn,pPVar18);
          }
          else {
            raviX_buffer_add_fstring(mb,"%s(rb)",pcVar16 + 3);
          }
          pcVar16 = ";\n";
        }
        else {
          if ((0xd < uVar6) || ((0x2011U >> uVar6 & 1) == 0)) {
            handle_error_bad_pseudo(fn,pPVar17,"Unexpected pseudo");
          }
          raviX_buffer_add_string(mb," TValue *ra = ");
          emit_reg_accessor(fn,pPVar17,0);
          raviX_buffer_add_fstring(mb,";\n %s(ra, ",pcVar27);
          if ((*(uint *)pPVar18 & 0xf) == 5 || (*(uint *)pPVar18 & 0xf) == uVar25) {
            emit_varname_or_constant(fn,pPVar18);
          }
          else {
            raviX_buffer_add_fstring(mb,"%s(rb)",pcVar16 + 3);
          }
          pcVar16 = ");\n";
        }
        goto LAB_00120c59;
      case '.':
      case '/':
        pPVar17 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->operands);
        pPVar18 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->targets);
        raviX_buffer_add_string(mb,"{\n TValue *len = ");
        emit_reg_accessor(fn,pPVar18,0);
        raviX_buffer_add_string(mb,";\n TValue *obj = ");
        emit_reg_accessor(fn,pPVar17,0);
        raviX_buffer_add_string(mb,";\n luaV_objlen(L, len, obj);\n");
        raviX_buffer_add_string(mb,"base = ci->u.l.base;\n");
        if (((undefined1  [48])*pPVar18 & (undefined1  [48])0xf) == (undefined1  [48])0x2) {
          raviX_buffer_add_string(mb," ");
          emit_varname_or_constant(fn,pPVar18);
          pcVar16 = " = ival0.value_.i;\n";
          goto LAB_00120c59;
        }
        goto LAB_00120c61;
      case '0':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
        raviX_buffer_add_string(mb,"{\n");
        raviX_buffer_add_string(mb," TValue *ra = ");
        pPVar17 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->targets);
        emit_reg_accessor(fn,pPVar17,0);
        switch(*(undefined1 *)insn) {
        case 0x30:
          raviX_buffer_add_string(mb,";\n lua_Integer i = 0;\n");
          uVar12 = 0;
          pcVar16 = " if (!tointegerns(ra, &i)) {\n";
          break;
        default:
          goto switchD_0011e800_caseD_31;
        case 0x32:
          uVar12 = 0xf;
          pcVar16 = ";\n if (!ttisnil(ra) && !ttisclosure(ra)) {\n";
          break;
        case 0x33:
          uVar12 = 0xe;
          pcVar16 = ";\n if (!ttisnil(ra) && !ttisstring(ra)) {\n";
          break;
        case 0x34:
          uVar12 = 2;
          pcVar16 = ";\n if (!ttisiarray(ra)) {\n";
          break;
        case 0x35:
          uVar12 = 3;
          pcVar16 = ";\n if (!ttisfarray(ra)) {\n";
          break;
        case 0x36:
          uVar12 = 4;
          pcVar16 = ";\n if (!ttisLtable(ra)) {\n";
        }
        raviX_buffer_add_string(mb,pcVar16);
        goto LAB_00120586;
      case '1':
        raviX_buffer_add_string(mb,"{\n");
        raviX_buffer_add_string(mb," TValue *ra = ");
        pPVar17 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->targets);
        emit_reg_accessor(fn,pPVar17,0);
        raviX_buffer_add_string(mb,";\n lua_Number n = 0;\n");
        raviX_buffer_add_string
                  (mb,
                   " if (ttisnumber(ra)) { n = (ttisinteger(ra) ? (double) ivalue(ra) : fltvalue(ra)); setfltvalue(ra, n); }\n"
                  );
        raviX_buffer_add_string(mb," else {\n");
        uVar12 = 1;
LAB_00120586:
        raviX_buffer_add_fstring(mb,"  raviX__error_code = %d;\n",uVar12);
        raviX_buffer_add_string(mb,"  goto Lraise_error;\n");
        pcVar16 = " }\n}\n";
        goto LAB_00120c68;
      case '7':
        pPVar17 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->operands);
        raviX_buffer_add_string(mb,"{\n");
        raviX_buffer_add_string(mb," TValue *ra = ");
        pPVar18 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->targets);
        emit_reg_accessor(fn,pPVar18,0);
        raviX_buffer_add_string(mb,";\n if (!ttisnil(ra)) {\n");
        raviX_buffer_add_string(mb,"  TValue *rb = ");
        emit_reg_accessor(fn,pPVar17,0);
        raviX_buffer_add_string(mb,";\n");
        raviX_buffer_add_string
                  (mb,"  if (!ttisshrstring(rb) || !raviV_check_usertype(L, tsvalue(rb), ra)) {\n");
        raviX_buffer_add_fstring(mb,"   raviX__error_code = %d;\n",0x10);
        raviX_buffer_add_string(mb,"   goto Lraise_error;\n");
        pcVar16 = "  }\n";
LAB_00120354:
        raviX_buffer_add_string(mb,pcVar16);
        pcVar16 = " }\n";
        goto LAB_00120c59;
      case '8':
        pPVar17 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->targets);
        pPVar18 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->operands);
        if (((undefined1  [48])*pPVar17 & (undefined1  [48])0xf) != (undefined1  [48])0x3) {
          raviX_buffer_add_string(mb,"{\n");
          raviX_buffer_add_string(mb," TValue *ra = ");
          emit_reg_accessor(fn,pPVar17,0);
          raviX_buffer_add_string(mb,";\n TValue *rb = ");
          pPVar17 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->operands);
          emit_reg_accessor(fn,pPVar17,0);
          raviX_buffer_add_string(mb,";\n int result = l_isfalse(rb);\n");
          pcVar16 = " setbvalue(ra, result);\n";
          goto LAB_00120c59;
        }
        if ((*(uint *)pPVar18 & 0xf) == 3) {
          raviX_buffer_add_string(mb,"{ ");
          emit_varname(fn,pPVar17);
          raviX_buffer_add_string(mb," = (0 == ");
          emit_varname_or_constant(fn,pPVar18);
          pcVar16 = "); }\n";
        }
        else {
          if ((*(uint *)pPVar18 & 0xf) - 1 < 2) {
            __assert_fail("operand->type != PSEUDO_TEMP_FLT && operand->type != PSEUDO_TEMP_INT",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/codegen.c"
                          ,0x8df,"int emit_op_not(Function *, Instruction *)");
          }
          raviX_buffer_add_string(mb,"{\n");
          raviX_buffer_add_string(mb," TValue *rb = ");
          pPVar18 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->operands);
          emit_reg_accessor(fn,pPVar18,0);
          raviX_buffer_add_string(mb,";\n ");
          emit_varname(fn,pPVar17);
          pcVar16 = " = l_isfalse(rb);\n}\n";
        }
        goto LAB_00120c68;
      case '9':
        raviX_buffer_add_string(mb,"{\n");
        raviX_buffer_add_string(mb," TValue *ra = ");
        pPVar17 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->targets);
        emit_reg_accessor(fn,pPVar17,0);
        raviX_buffer_add_string(mb,";\n TValue *rb = ");
        pPVar17 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->operands);
        emit_reg_accessor(fn,pPVar17,0);
        pcVar16 = ";\n raviV_op_bnot(L, ra, rb);\n";
        goto LAB_0012051a;
      case ':':
      case 'P':
      case 'Q':
      case 'R':
      case 'S':
      case 'T':
      case 'U':
      case 'V':
      case 'X':
        pcVar27 = "luaV_gettable";
        if (cVar1 == 'U') {
          pcVar27 = "raviV_gettable_sskey";
        }
        pcVar16 = "raviV_gettable_i";
        if (cVar1 != 'T') {
          pcVar16 = pcVar27;
        }
        pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
        pPVar18 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,1);
        pPVar7 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
        if (((((undefined1  [48])*pPVar18 & (undefined1  [48])0xf) == (undefined1  [48])0x5) &&
            (((pPVar18->field_3).constant)->type == 0x101)) &&
           (((((pPVar18->field_3).constant)->field_2).s)->len < 0x28)) {
          pcVar16 = "raviV_gettable_sskey";
        }
        raviX_buffer_add_string(mb,"{\n");
        raviX_buffer_add_string(mb," TValue *tab = ");
        emit_reg_accessor(fn,pPVar17,0);
        raviX_buffer_add_string(mb,";\n TValue *key = ");
        emit_reg_accessor(fn,pPVar18,0);
        raviX_buffer_add_string(mb,";\n TValue *dst = ");
        emit_reg_accessor(fn,pPVar7,1);
        pcVar27 = ";\n %s(L, tab, key, dst);\n ";
        goto LAB_0011f0f4;
      case ';':
        pPVar17 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->targets);
        raviX_buffer_add_string(mb,"{\n");
        raviX_buffer_add_string(mb," TValue *ra = ");
        emit_reg_accessor(fn,pPVar17,0);
        pcVar16 = ";\n raviV_op_newtable(L, ci, ra, 0, 0);\n";
        goto LAB_0012051a;
      case '<':
      case '=':
        emit_op_newarray(fn,insn);
        goto LAB_001216b8;
      case '>':
      case '?':
      case '@':
      case 'A':
      case 'B':
      case 'C':
      case 'D':
      case 'F':
      case 'Z':
        pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
        if (*(char *)insn == 'C') {
          pcVar16 = "raviV_settable_sskey";
        }
        else if (*(char *)insn == 'B') {
          if (((undefined1  [48])*pPVar17 & (undefined1  [48])0xf) == (undefined1  [48])0xb) {
            emit_store_range_to_table(fn,insn);
            goto LAB_001216b8;
          }
          pcVar16 = "raviV_settable_i";
        }
        else {
          pcVar16 = "luaV_settable";
        }
        pPVar18 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
        pPVar7 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,1);
        if (((((undefined1  [48])*pPVar7 & (undefined1  [48])0xf) == (undefined1  [48])0x5) &&
            (((pPVar7->field_3).constant)->type == 0x101)) &&
           (((((pPVar7->field_3).constant)->field_2).s)->len < 0x28)) {
          pcVar16 = "raviV_settable_sskey";
        }
        raviX_buffer_add_string(mb,"{\n");
        raviX_buffer_add_string(mb," TValue *tab = ");
        emit_reg_accessor(fn,pPVar18,0);
        raviX_buffer_add_string(mb,";\n TValue *key = ");
        emit_reg_accessor(fn,pPVar7,0);
        raviX_buffer_add_string(mb,";\n TValue *src = ");
        emit_reg_accessor(fn,pPVar17,1);
        pcVar27 = ";\n %s(L, tab, key, src);\n ";
LAB_0011f0f4:
        raviX_buffer_add_fstring(mb,pcVar27,pcVar16);
        pcVar16 = "base = ci->u.l.base;\n";
        goto LAB_0012169c;
      case 'E':
      case 'G':
        bVar33 = cVar1 == 'E';
        pcVar16 = "lua_Number *";
        local_258 = "setfltvalue";
        if (bVar33) {
          local_258 = "setivalue";
          pcVar16 = "lua_Integer *";
        }
        local_258 = local_258 + 3;
        local_260 = "raviH_set_float";
        local_268 = (char *)CONCAT71(local_268._1_7_,bVar33);
        if (bVar33) {
          local_260 = "raviH_set_int";
        }
        pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
        pPVar18 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,1);
        pPVar7 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
        if (((undefined1  [48])*pPVar7 & (undefined1  [48])0xf) != (undefined1  [48])0xb) {
          raviX_buffer_add_string(mb,"{\n");
          raviX_buffer_add_string(mb," RaviArray *arr = arrvalue(");
          emit_reg_accessor(fn,pPVar17,0);
          raviX_buffer_add_string(mb,");\n lua_Unsigned ukey = (lua_Unsigned) ");
          uVar25 = *(uint *)pPVar18 & 0xf;
          if (uVar25 == 0) {
            raviX_buffer_add_string(mb,"ivalue(");
            emit_reg_accessor(fn,pPVar18,0);
            raviX_buffer_add_string(mb,")");
          }
          else if (uVar25 == 2) {
            emit_varname(fn,pPVar18);
          }
          else {
            if (uVar25 != 5) goto LAB_00121815;
            raviX_buffer_add_fstring(mb,"%lld",((pPVar18->field_3).proc)->nodes);
          }
          uVar6 = (uint)(byte)local_268;
          raviX_buffer_add_string(mb,";\n");
          raviX_buffer_add_fstring(mb," %siptr = (%s)arr->data;\n ",pcVar16,pcVar16);
          raviX_buffer_add_string(mb,"if (ukey < (lua_Unsigned)(arr->len)) {\n");
          raviX_buffer_add_string(mb," iptr[ukey] = ");
          uVar25 = *(uint *)pPVar7 & 0xf;
          if (uVar25 == uVar6 + 1) {
            emit_varname(fn,pPVar7);
          }
          else {
            if (uVar25 < 5) {
              if ((uVar25 != 0) && (uVar25 != 4)) {
LAB_00121930:
                pcVar16 = "Unexpected src pseudo";
LAB_0012186b:
                (*fn->api->error_message)(fn->api->context,pcVar16);
                longjmp((__jmp_buf_tag *)fn->env,1);
              }
            }
            else {
              if (uVar25 == 5) {
                if (((pPVar7->field_3).constant)->type == 8) {
                  raviX_buffer_add_fstring(mb,"%lld",(((pPVar7->field_3).constant)->field_2).i);
                }
                else {
                  raviX_buffer_add_fstring(mb,"%g");
                }
                goto LAB_00121028;
              }
              if (uVar25 != 0xd) goto LAB_00121930;
            }
            raviX_buffer_add_fstring(mb,"%s(",local_258);
            emit_reg_accessor(fn,pPVar7,0);
            raviX_buffer_add_string(mb,")");
          }
LAB_00121028:
          raviX_buffer_add_string(mb,";\n} else {\n");
          raviX_buffer_add_fstring(mb," %s(L, arr, ukey, ",local_260);
          uVar25 = *(uint *)pPVar7 & 0xf;
          if (uVar25 == uVar6 + 1) {
            emit_varname(fn,pPVar7);
          }
          else if (uVar25 < 5) {
            if ((uVar25 == 0) || (uVar25 == 4)) {
LAB_0012108a:
              raviX_buffer_add_fstring(mb,"%s(",local_258);
              emit_reg_accessor(fn,pPVar7,0);
              raviX_buffer_add_string(mb,")");
            }
          }
          else if (uVar25 == 5) {
            if (((pPVar7->field_3).constant)->type == 8) {
              raviX_buffer_add_fstring(mb,"%lld",(((pPVar7->field_3).constant)->field_2).i);
            }
            else {
              raviX_buffer_add_fstring(mb,"%g");
            }
          }
          else if (uVar25 == 0xd) goto LAB_0012108a;
          raviX_buffer_add_string(mb,");\n");
          pcVar16 = "}\n}\n";
          goto LAB_00120c68;
        }
        emit_store_range_to_table(fn,insn);
        goto LAB_001216b8;
      case 'H':
        pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
        switch(*(uint *)pPVar17 & 0xf) {
        case 0:
        case 4:
        case 0xc:
          raviX_buffer_add_string(mb,"{\nconst TValue *src_reg = ");
          emit_reg_accessor(fn,pPVar17,0);
          pvVar20 = raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
          raviX_buffer_add_fstring
                    (mb,";\nif (!l_isfalse(src_reg)) goto L%d;\n",
                     (ulong)**(uint **)((long)pvVar20 + 8));
          pvVar20 = raviX_ptrlist_nth_entry((PtrList *)insn->targets,1);
          puVar9 = *(uint **)((long)pvVar20 + 8);
          pcVar16 = "else goto L%d;\n";
          break;
        default:
          pcVar16 = "emit_op_cbr: Unexpected pseudo";
LAB_001217cf:
          handle_error_bad_pseudo(fn,pPVar17,pcVar16);
        case 3:
          raviX_buffer_add_string(mb,"{");
          raviX_buffer_add_string(mb," if (");
          emit_varname(fn,pPVar17);
          pvVar20 = raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
          raviX_buffer_add_fstring(mb," != 0) goto L%d;",(ulong)**(uint **)((long)pvVar20 + 8));
          pvVar20 = raviX_ptrlist_nth_entry((PtrList *)insn->targets,1);
          puVar9 = *(uint **)((long)pvVar20 + 8);
          pcVar16 = " else goto L%d; ";
          break;
        case 5:
        case 8:
          goto switchD_0011e5ec_caseD_49;
        case 7:
        case 9:
          list_00 = insn->targets;
          uVar25 = 1;
          goto LAB_0011fa17;
        }
        raviX_buffer_add_fstring(mb,pcVar16,(ulong)*puVar9);
        goto LAB_00120c61;
      case 'I':
switchD_0011e5ec_caseD_49:
        list_00 = insn->targets;
        uVar25 = 0;
LAB_0011fa17:
        pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)list_00,uVar25);
        emit_jump(fn,pPVar17);
        goto LAB_001216b8;
      case 'J':
      case 'K':
      case 'M':
        pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
        pPVar18 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
        iVar26 = emit_move(fn,pPVar17,pPVar18);
        goto LAB_001212fa;
      case 'L':
        pPVar17 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->targets);
        pPVar18 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->operands);
        raviX_buffer_add_string(mb,"{\n");
        raviX_buffer_add_string(mb," TValue *rb = ");
        emit_reg_accessor(fn,pPVar18,0);
        raviX_buffer_add_string(mb,";\n");
        raviX_buffer_add_string(mb," lua_Number n = 0.0;\n");
        raviX_buffer_add_string(mb," if (!tonumberns(rb, n)) {\n");
        raviX_buffer_add_fstring(mb,"  raviX__error_code = %d;\n",1);
        raviX_buffer_add_string(mb,"  goto Lraise_error;\n");
        raviX_buffer_add_string(mb," }\n");
        uVar25 = *(uint *)pPVar17 & 0xf;
        if (uVar25 < 4) {
          if (uVar25 != 0) {
            if (uVar25 != 1) goto LAB_001218fd;
            raviX_buffer_add_string(mb," ");
            emit_varname(fn,pPVar17);
            pcVar16 = " = n;\n";
            goto LAB_00120c59;
          }
        }
        else if ((uVar25 != 4) && (uVar25 != 0xd)) {
LAB_001218fd:
          pcVar16 = "Unexpected pseudo";
LAB_0012179d:
          handle_error_bad_pseudo(fn,pPVar17,pcVar16);
        }
        raviX_buffer_add_string(mb," TValue *ra = ");
        emit_reg_accessor(fn,pPVar17,0);
        pcVar16 = ";\n setfltvalue(ra, n);\n";
        goto LAB_00120c59;
      case 'N':
        pPVar17 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->targets);
        pPVar18 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->operands);
        raviX_buffer_add_string(mb,"{\n");
        raviX_buffer_add_string(mb," TValue *rb = ");
        emit_reg_accessor(fn,pPVar18,0);
        raviX_buffer_add_string(mb,";\n");
        raviX_buffer_add_string(mb," lua_Integer i = 0;\n");
        raviX_buffer_add_string(mb," if (!tointegerns(rb, &i)) {\n");
        raviX_buffer_add_fstring(mb,"  raviX__error_code = %d;\n",0);
        raviX_buffer_add_string(mb,"  goto Lraise_error;\n");
        raviX_buffer_add_string(mb," }\n");
        uVar25 = *(uint *)pPVar17 & 0xf;
        if (uVar25 < 4) {
          if (uVar25 != 0) {
            if (uVar25 != 2) goto LAB_001218f4;
            raviX_buffer_add_string(mb," ");
            emit_varname(fn,pPVar17);
            pcVar16 = " = i;\n";
            goto LAB_00120c59;
          }
        }
        else if ((uVar25 != 4) && (uVar25 != 0xd)) {
LAB_001218f4:
          pcVar16 = "Unexpected target pseudo";
          goto LAB_0012179d;
        }
        raviX_buffer_add_string(mb," TValue *ra = ");
        emit_reg_accessor(fn,pPVar17,0);
        pcVar16 = ";\n setivalue(ra, i);\n";
        goto LAB_00120c59;
      case 'O':
        iVar26 = raviX_ptrlist_size((PtrList *)insn->targets);
        if (iVar26 != 2) {
          __assert_fail("get_num_targets(insn) == 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/codegen.c"
                        ,0x602,"int emit_op_call(Function *, Instruction *)");
        }
        uVar25 = raviX_ptrlist_size((PtrList *)insn->operands);
        pcVar16 = (char *)(ulong)uVar25;
        puVar9 = (uint *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
        if (((*puVar9 & 0xf) != 4) && ((*puVar9 & 0xf) != 0xb)) {
          __assert_fail("target_base->type == PSEUDO_TEMP_ANY || target_base->type == PSEUDO_RANGE",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/codegen.c"
                        ,0x608,"int emit_op_call(Function *, Instruction *)");
        }
        puVar9 = (uint *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
        uVar6 = *puVar9;
        pvVar20 = raviX_ptrlist_nth_entry((PtrList *)insn->targets,1);
        local_260 = *(char **)(*(long *)((long)pvVar20 + 8) + 8);
        raviX_buffer_add_fstring
                  (mb," if (stackoverflow(L,%d)) { luaD_growstack(L, %d); base = ci->u.l.base; }\n",
                   (ulong)(uVar25 + 1));
        bVar33 = true;
        if (uVar25 < 2) {
          bVar33 = true;
        }
        else {
          uVar25 = uVar25 - 1;
          pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,uVar25);
          if ((*(uint *)pPVar17 & 0xf) == 0xb) {
            uVar30 = (uVar6 >> 4 & 0xffff) + uVar25;
            if ((*(uint *)pPVar17 >> 4 & 0xffff) != uVar30) {
              raviX_buffer_add_string(mb,"{\n");
              raviX_buffer_add_string(mb," TValue *src_base = ");
              emit_reg_accessor(fn,pPVar17,0);
              raviX_buffer_add_string(mb,";\n");
              raviX_buffer_add_string(mb," TValue *dest_base = ");
              local_1b8._4_4_ = 0;
              local_1b8._8_4_ = 0;
              local_1b8._12_4_ = ~RAVI_TANY;
              local_1b8._16_8_ = 0;
              local_1b8._24_8_ = 0;
              local_1b8._32_8_ = (Pseudo *)0x0;
              local_1b8._40_8_ = (Pseudo *)0x0;
              local_1b8._0_4_ = (uVar30 & 0xffff) << 4 | SYM_ENV;
              emit_reg_accessor(fn,(Pseudo *)local_1b8,0);
              raviX_buffer_add_string(mb,";\n TValue *src = L->top-1;\n");
              raviX_buffer_add_string(mb," L->top = dest_base + (L->top-src_base);\n");
              raviX_buffer_add_string(mb," TValue *dest = L->top-1;\n");
              raviX_buffer_add_string(mb," while (src >= src_base) {\n");
              raviX_buffer_add_string
                        (mb,"  dest->tt_ = src->tt_; dest->value_.gc = src->value_.gc;\n");
              raviX_buffer_add_string(mb,"  src--;\n");
              raviX_buffer_add_string(mb,"  dest--;\n");
              raviX_buffer_add_string(mb," }\n");
              raviX_buffer_add_string(mb,"}\n");
            }
            bVar33 = false;
            pcVar16 = (char *)(ulong)uVar25;
          }
        }
        uVar25 = (int)pcVar16 - 1;
        local_268 = pcVar16;
        if (-1 < (int)uVar25) {
          SVar28 = ((uVar6 >> 4) + (int)pcVar16) * 0x10;
          do {
            SVar28 = SVar28 - 0x10;
            local_1b8._0_4_ = SVar28 & 0xffff0 | SYM_ENV;
            local_1b8._4_4_ = 0;
            local_1b8._8_4_ = 0;
            local_1b8._12_4_ = ~RAVI_TANY;
            local_1b8._16_8_ = 0;
            local_1b8._24_8_ = 0;
            local_1b8._32_8_ = (Pseudo *)0x0;
            local_1b8._40_8_ = (Pseudo *)0x0;
            pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,uVar25);
            emit_move(fn,pPVar17,(Pseudo *)local_1b8);
            bVar32 = uVar25 != 0;
            uVar25 = uVar25 - 1;
          } while (bVar32);
        }
        if (bVar33) {
          raviX_buffer_add_string(mb," L->top = ");
          pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
          emit_reg_accessor(fn,pPVar17,0);
          raviX_buffer_add_fstring(mb," + %d;\n",local_268);
        }
        raviX_buffer_add_string(mb,"{\n TValue *ra = ");
        pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
        emit_reg_accessor(fn,pPVar17,0);
        pcVar16 = local_260;
        raviX_buffer_add_fstring
                  (mb,";\n int result = luaD_precall(L, ra, %d, 1);\n",(ulong)local_260 & 0xffffffff
                  );
        raviX_buffer_add_string(mb," if (result) {\n");
        raviX_buffer_add_fstring(mb,"  if (result == 1 && %d >= 0)\n",(ulong)pcVar16 & 0xffffffff);
        raviX_buffer_add_string(mb,"   L->top = ci->top;\n");
        raviX_buffer_add_string(mb," }\n");
        raviX_buffer_add_string(mb," else {  /* Lua function */\n");
        raviX_buffer_add_string(mb,"  result = luaV_execute(L);\n");
        raviX_buffer_add_string(mb,"  if (result) L->top = ci->top;\n");
        raviX_buffer_add_string(mb," }\n");
        pcVar16 = " base = ci->u.l.base;\n";
        goto LAB_0012169c;
      case 'W':
      case 'Y':
        pcVar16 = "lua_Number *";
        local_268 = "setfltvalue";
        if (cVar1 == 'W') {
          pcVar16 = "lua_Integer *";
          local_268 = "setivalue";
        }
        pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
        pPVar18 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,1);
        pPVar7 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
        raviX_buffer_add_string(mb,"{\n");
        raviX_buffer_add_string(mb," RaviArray *arr = arrvalue(");
        emit_reg_accessor(fn,pPVar17,0);
        raviX_buffer_add_string(mb,");\n lua_Unsigned ukey = (lua_Unsigned) ");
        uVar25 = *(uint *)pPVar18 & 0xf;
        if (uVar25 == 0) {
          raviX_buffer_add_string(mb,"ivalue(");
          emit_reg_accessor(fn,pPVar18,0);
          raviX_buffer_add_string(mb,")");
        }
        else if (uVar25 == 2) {
          emit_varname(fn,pPVar18);
        }
        else {
          if (uVar25 != 5) {
LAB_00121815:
            pcVar16 = "Unexpected key pseudo";
            goto LAB_0012186b;
          }
          raviX_buffer_add_fstring(mb,"%lld",((pPVar18->field_3).proc)->nodes);
        }
        raviX_buffer_add_string(mb,";\n");
        raviX_buffer_add_fstring(mb," %siptr = (%s)arr->data;\n ",pcVar16,pcVar16);
        uVar25 = *(uint *)pPVar7 & 0xf;
        if (uVar25 == (cVar1 == 'W') + 1) {
          emit_varname(fn,pPVar7);
          raviX_buffer_add_string(mb," = iptr[ukey];\n");
        }
        else {
          if ((0xd < uVar25) || ((0x2011U >> uVar25 & 1) == 0)) {
            pRVar21 = fn->api;
            pcVar16 = "Unexpected dest pseudo";
            goto LAB_0012175c;
          }
          raviX_buffer_add_string(mb,"TValue *dest_reg = ");
          emit_reg_accessor(fn,pPVar7,0);
          raviX_buffer_add_fstring(mb,"; %s(dest_reg, iptr[ukey]);\n",local_268);
        }
        goto LAB_00120c61;
      case '[':
        pPVar17 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->operands);
        raviX_buffer_add_string(mb,"{\n TValue *clsvar = ");
        emit_reg_accessor(fn,pPVar17,0);
        raviX_buffer_add_string(mb,";\n");
        pcVar16 = " luaF_close(L, clsvar, LUA_OK);\n";
LAB_0012051a:
        raviX_buffer_add_string(mb,pcVar16);
        pcVar16 = "base = ci->u.l.base;\n";
LAB_00120c59:
        raviX_buffer_add_string(mb,pcVar16);
LAB_00120c61:
        pcVar16 = "}\n";
LAB_00120c68:
        raviX_buffer_add_string(mb,pcVar16);
        goto LAB_001216b8;
      case '\\':
        uVar6 = raviX_ptrlist_size((PtrList *)insn->operands);
        uVar30 = 0;
        raviX_buffer_add_fstring
                  (mb," if (stackoverflow(L,%d)) { luaD_growstack(L, %d); base = ci->u.l.base; }\n",
                   (ulong)uVar6,(ulong)uVar6);
        raviX_buffer_add_string(mb,"{\n");
        uVar25 = (fn->proc->temp_pseudos).max_reg;
        if (uVar6 != 0) {
          SVar28 = uVar25 << 4;
          do {
            local_1b8._0_4_ = SVar28 & 0xffff0 | SYM_ENV;
            local_1b8._4_4_ = 0;
            local_1b8._8_4_ = 0;
            local_1b8._12_4_ = ~RAVI_TANY;
            local_1b8._16_8_ = 0;
            local_1b8._24_8_ = 0;
            local_1b8._32_8_ = (Pseudo *)0x0;
            local_1b8._40_8_ = (Pseudo *)0x0;
            pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,uVar30);
            if (((undefined1  [48])*pPVar17 & (undefined1  [48])0xf) == (undefined1  [48])0xb) {
              pPVar17 = raviX_allocate_range_select_pseudo(fn->proc,pPVar17,0);
            }
            emit_move(fn,pPVar17,(Pseudo *)local_1b8);
            uVar30 = uVar30 + 1;
            SVar28 = SVar28 + 0x10;
          } while (uVar6 != uVar30);
        }
        raviX_buffer_add_string(mb," L->top = ");
        local_1b8._4_4_ = 0;
        local_1b8._8_4_ = 0;
        local_1b8._12_4_ = ~RAVI_TANY;
        local_1b8._16_8_ = 0;
        local_1b8._24_8_ = 0;
        local_1b8._32_8_ = (Pseudo *)0x0;
        local_1b8._40_8_ = (Pseudo *)0x0;
        SVar28 = (uVar25 & 0xffff) << 4 | SYM_ENV;
        local_1b8._0_4_ = SVar28;
        emit_reg_accessor(fn,(Pseudo *)local_1b8,0);
        raviX_buffer_add_fstring(mb," + %d;\n",(ulong)uVar6);
        raviX_buffer_add_fstring(mb," luaV_concat(L, %d);\n",(ulong)uVar6);
        raviX_buffer_add_string(mb," base = ci->u.l.base;\n");
        raviX_buffer_add_string(mb," L->top = ci->top;\n");
        local_238._4_4_ = 0;
        local_238._8_8_ = (LuaSymbol *)0x0;
        local_238._16_8_ = (StringObject *)0x0;
        local_238._32_8_ = (Scope *)0x0;
        local_238._40_8_ = (LuaSymbol *)0x0;
        local_238._0_4_ = SVar28;
        local_238._24_8_ = local_238._8_8_;
        pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
        emit_move(fn,(Pseudo *)local_238,pPVar17);
        goto LAB_001216a4;
      case ']':
        pPVar17 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->targets);
        local_1b8._4_4_ = 0;
        local_1b8._8_4_ = 0;
        local_1b8._12_4_ = ~RAVI_TANY;
        local_1b8._8_8_ = (LuaSymbol *)0x0;
        local_1b8._16_8_ = 0;
        local_1b8._24_8_ = 0;
        local_1b8._32_8_ = (Pseudo *)0x0;
        local_1b8._40_8_ = (Pseudo *)0x0;
        local_1b8._0_4_ = SYM_ENV|SYM_LABEL;
        uVar25 = *(uint *)pPVar17 & 0xf;
        if (0xd < uVar25) {
LAB_0012190c:
          handle_error_bad_pseudo(fn,pPVar17,"Unexpected pseudo");
        }
        if ((0x2011U >> uVar25 & 1) == 0) {
          if (((0xcU >> uVar25 & 1) == 0) && (uVar25 != 1)) goto LAB_0012190c;
          local_1b8._8_8_ = local_238;
          local_238._0_4_ = (undefined4)DAT_00141c38;
          local_238._4_4_ = DAT_00141c38._4_4_;
          local_238._8_8_ = DAT_00141c38._8_8_;
          local_1b8._0_4_ = SYM_ENV|SYM_UPVALUE;
        }
        emit_move(fn,(Pseudo *)local_1b8,pPVar17);
        goto LAB_001216b8;
      case '^':
        local_238._64_8_ = (fn->body).pos;
        local_238._48_8_ = mb->buf;
        local_238._56_8_ = (fn->body).capacity;
        (fn->body).pos = 0;
        mb->buf = (char *)SUB168(ZEXT816(0) << 0x20,0);
        mb->capacity = SUB168(ZEXT816(0) << 0x20,8);
        raviX_buffer_add_string(mb,"{\n");
        iVar26 = raviX_ptrlist_size((PtrList *)insn->operands);
        if (iVar26 != 0) {
          uVar25 = 0;
          do {
            pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,uVar25);
            if ((*(uint *)pPVar17 & 0xf) - 1 < 2) {
              pPVar23 = (pPVar17->field_3).proc;
              if (pPVar23 == (Proc *)0x0) {
LAB_00121792:
                pcVar16 = "Unsupported pseudo type in C bind variables";
                goto LAB_0012179d;
              }
            }
            else {
              if ((*(uint *)pPVar17 & 0xf) != 0) goto LAB_00121792;
              pPVar23 = (pPVar17->field_3).proc;
            }
            iVar26 = *(int *)&pPVar23->nodes;
            if (iVar26 == 0x10) {
              pLVar8 = pPVar23->linearizer;
              pcVar16 = " lua_Number %s = ";
LAB_0011f373:
              raviX_buffer_add_fstring(mb,pcVar16,pLVar8->all_procs);
              emit_varname_or_constant(fn,pPVar17);
              pcVar16 = " ;\n";
            }
            else {
              if (iVar26 == 8) {
                pLVar8 = pPVar23->linearizer;
                pcVar16 = " lua_Integer %s = ";
                goto LAB_0011f373;
              }
              if (iVar26 == 0x20) {
                pcVar16 = " Ravi_IntegerArray %s = {0};\n";
              }
              else {
                if (iVar26 < 0x101) {
                  if (iVar26 != -1) {
                    if (iVar26 != 0x40) goto LAB_00121886;
                    pcVar16 = " Ravi_NumberArray %s = {0};\n";
                    goto LAB_0011f3ea;
                  }
                }
                else if ((iVar26 != 0x401) && (iVar26 != 0x101)) {
LAB_00121886:
                  pcVar16 = "Unsupported symbol type in C bind variable";
                  goto LAB_0012179d;
                }
                pcVar16 = " Ravi_StringOrUserData %s = {0};\n";
              }
LAB_0011f3ea:
              raviX_buffer_add_fstring(mb,pcVar16,pPVar23->linearizer->all_procs);
              raviX_buffer_add_string(mb," {\n");
              raviX_buffer_add_fstring(mb,"  TValue *raviX__%s = ",pPVar23->linearizer->all_procs);
              emit_reg_accessor(fn,(Pseudo *)pPVar23->current_scope,0);
              raviX_buffer_add_string(mb,";\n");
              if (iVar26 == 0x20) {
                pcVar16 = "  %s.ptr = (lua_Integer*) arrvalue(raviX__%s)->data;\n";
                pPVar22 = pPVar23->linearizer->all_procs;
LAB_0011f47a:
                raviX_buffer_add_fstring(mb,pcVar16,pPVar22,pPVar22);
                raviX_buffer_add_fstring
                          (mb,"  %s.len = (unsigned int) arrvalue(raviX__%s)->len;\n",
                           pPVar23->linearizer->all_procs);
              }
              else {
                pPVar22 = pPVar23->linearizer->all_procs;
                if (iVar26 == 0x40) {
                  pcVar16 = "  %s.ptr = (lua_Number *) arrvalue(raviX__%s)->data;\n";
                  goto LAB_0011f47a;
                }
                raviX_buffer_add_fstring(mb,"  if (ttisfulluserdata(raviX__%s)) {\n");
                raviX_buffer_add_fstring
                          (mb,"   %s.ptr = getudatamem(uvalue(raviX__%s));\n",
                           pPVar23->linearizer->all_procs);
                raviX_buffer_add_fstring
                          (mb,"   %s.len = (unsigned int) sizeudata(gco2u(raviX__%s));\n",
                           pPVar23->linearizer->all_procs);
                raviX_buffer_add_string(mb,"  }\n");
                raviX_buffer_add_fstring
                          (mb,"  else if (ttislightuserdata(raviX__%s)) {\n",
                           pPVar23->linearizer->all_procs);
                raviX_buffer_add_fstring
                          (mb,"   %s.ptr = pvalue(raviX__%s);\n",pPVar23->linearizer->all_procs);
                raviX_buffer_add_fstring(mb,"   %s.len = 0;\n",pPVar23->linearizer->all_procs);
                raviX_buffer_add_string(mb,"  }\n");
                raviX_buffer_add_fstring
                          (mb,"  else if (ttisstring(raviX__%s)) {\n",pPVar23->linearizer->all_procs
                          );
                raviX_buffer_add_fstring
                          (mb,"   %s.ptr = svalue(raviX__%s);\n",pPVar23->linearizer->all_procs);
                raviX_buffer_add_fstring
                          (mb,"   %s.len = vslen(raviX__%s);\n",pPVar23->linearizer->all_procs);
                raviX_buffer_add_string(mb,"  }\n");
                raviX_buffer_add_string(mb,"  else {\n");
                raviX_buffer_add_fstring(mb,"   raviX__error_code = %d;\n",0x10);
                raviX_buffer_add_string(mb,"   goto Lraise_error;\n");
                raviX_buffer_add_string(mb,"  }\n");
              }
              pcVar16 = "  }\n";
            }
            raviX_buffer_add_string(mb,pcVar16 + 1);
            uVar25 = uVar25 + 1;
            uVar6 = raviX_ptrlist_size((PtrList *)insn->operands);
          } while (uVar25 < uVar6);
        }
        puVar9 = (uint *)raviX_ptrlist_first((PtrList *)insn->targets);
        if (((*puVar9 & 0xf) != 5) || (**(short **)(puVar9 + 2) != 0x101)) {
          __assert_fail("C_code->type == PSEUDO_CONSTANT && C_code->constant->type == RAVI_TSTRING",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/codegen.c"
                        ,0xba3,"int emit_op_C__unsafe(Function *, Instruction *)");
        }
        raviX_buffer_add_string(mb," {\n");
        raviX_buffer_add_string(mb,*(char **)(*(long *)(*(long *)(puVar9 + 2) + 8) + 0x10));
        raviX_buffer_add_string(mb," }\n");
        iVar26 = raviX_ptrlist_size((PtrList *)insn->operands);
        if (iVar26 != 0) {
          uVar25 = 0;
          do {
            pvVar20 = raviX_ptrlist_nth_entry((PtrList *)insn->operands,uVar25);
            lVar2 = *(long *)((long)pvVar20 + 8);
            iVar26 = *(int *)(lVar2 + 8);
            if ((iVar26 == 0x10) || (iVar26 == 8)) {
              raviX_buffer_add_string(mb," {\n");
              raviX_buffer_add_string(mb,"  ");
              uVar6 = *(uint *)*(Pseudo **)(lVar2 + 0x38) & 0xf;
              if (uVar6 - 1 < 3) {
                emit_varname(fn,*(Pseudo **)(lVar2 + 0x38));
                raviX_buffer_add_string(mb," = ");
                pcVar16 = "%s;\n";
LAB_0011f6f5:
                raviX_buffer_add_fstring(mb,pcVar16,*(undefined8 *)(*(long *)(lVar2 + 0x18) + 0x10))
                ;
              }
              else if (uVar6 == 0) {
                raviX_buffer_add_string(mb," TValue *raviX__var = ");
                emit_reg_accessor(fn,*(Pseudo **)(lVar2 + 0x38),0);
                raviX_buffer_add_string(mb,";\n");
                if (iVar26 == 8) {
                  pcVar16 = "setivalue(raviX__var, %s);\n";
                }
                else {
                  if (iVar26 != 0x10) {
                    __assert_fail("type == RAVI_TNUMFLT",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/codegen.c"
                                  ,0xb85,
                                  "void emit_userdata_C_variable_store(Function *, Instruction *, Pseudo *)"
                                 );
                  }
                  pcVar16 = "setfltvalue(raviX__var, %s);\n";
                }
                goto LAB_0011f6f5;
              }
              raviX_buffer_add_string(mb," }\n");
            }
            uVar25 = uVar25 + 1;
            uVar6 = raviX_ptrlist_size((PtrList *)insn->operands);
          } while (uVar25 < uVar6);
        }
        raviX_buffer_add_string(mb,"\n}\n");
        local_1e8.pos = (fn->body).pos;
        local_1e8.buf = mb->buf;
        local_1e8.capacity = (fn->body).capacity;
        mb->buf = (char *)local_238._48_8_;
        (fn->body).capacity = local_238._56_8_;
        (fn->body).pos = local_238._64_8_;
        raviX_buffer_init(&local_250,0x400);
        raviX_buffer_add_string
                  (&local_250,
                   "typedef long long int64_t;\ntypedef double lua_Number;\ntypedef int64_t lua_Integer;\ntypedef struct {\n   union { lua_Integer i; lua_Number n; } value_;\n} TValue;\nstatic lua_Integer ivalue(const TValue *v) { return 0; }\nstatic void setivalue(TValue *v, lua_Integer i) {}\nstatic lua_Number  fvalue(const TValue *v) { return 0.0; }\nstatic void setfltvalue(TValue *v, lua_Number f) {}\ntypedef struct {\n   char *data;\n   unsigned int len;\n} Ravi_Arr;\nstatic Ravi_Arr *arrvalue(const TValue *v) { return (Ravi_Arr *)v; }\nstatic int ttisfulluserdata(const TValue *v) { return 0; }\nstatic int ttislightuserdata(const TValue *v) { return 0; }\nstatic int ttisstring(const TValue *v) { return 0; }\nstatic void *uvalue(const TValue *v) { return (void*)0; }\nstatic void *pvalue(const TValue *v) { return (void*)0; }\nstatic void *svalue(const TValue *v) { return (void*)0; }\nstatic void *getudatamem(const TValue *v) { return (void*)0; }\nstatic void *gco2u(const TValue *v) { return (void*)0; }\nstatic unsigned int sizeudata(const void *p) { return 0; }\nstatic unsigned int vslen(const TValue *v) { return 0; }\nstatic void settt_(TValue *v, int tt) {}\nTValue *R(int reg) { return (void*)0; }\nstatic const int LUA_TNIL = 0;\nstatic const int LUA_TBOOLEAN = 1;\nstatic const int LUA_TLIGHTUSERDATA = 2;\nstatic const int LUA_TNUMBER = 3;\nstatic const int LUA_TSTRING = 4;\nstatic const int LUA_TTABLE = 5;\nstatic const int LUA_TFUNCTION = 6;\nstatic const int LUA_TUSERDATA = 7;\nstatic const int LUA_TTHREAD = 8;\ntypedef struct {\n   char *ptr;\n   unsigned int len;\n} Ravi_StringOrUserData;\ntypedef struct {\n  lua_Integer *ptr;\n  unsigned int len;\n} Ravi_IntegerArray;\ntypedef struct {\n  lua_Number *ptr;\n  unsigned int len;\n} Ravi_NumberArray;\nint raviX__error_code;\n"
                  );
        raviX_buffer_add_string
                  (&local_250,
                   "\nTValue ival0;\nTValue fval0;\nTValue bval0;\nTValue ival1;\nTValue fval1;\nTValue bval1;\nTValue ival2;\nTValue fval2;\nTValue bval2;\n"
                  );
        pcVar16 = (fn->proc->linearizer->C_declarations).buf;
        if (pcVar16 != (char *)0x0) {
          raviX_buffer_add_string(&local_250,pcVar16);
        }
        pcVar16 = (fn->C_local_declarations).buf;
        if (pcVar16 != (char *)0x0) {
          raviX_buffer_add_string(&local_250,pcVar16);
        }
        pCVar3 = fn->proc->linearizer->compiler_state->allocator;
        local_238._8_8_ = pCVar3->realloc;
        local_238._16_8_ = pCVar3->calloc;
        local_238._24_8_ = pCVar3->free;
        local_238._32_8_ = pCVar3->create_arena;
        local_238._40_8_ = pCVar3->destroy_arena;
        local_238._0_4_ = SUB84(pCVar3->arena,0);
        local_238._4_4_ = (undefined4)((ulong)pCVar3->arena >> 0x20);
        uVar12 = (*(code *)local_238._32_8_)(0,0);
        local_238._0_4_ = (undefined4)uVar12;
        local_238._4_4_ = (undefined4)((ulong)uVar12 >> 0x20);
        local_26c.status = 0;
        C_parser_init((C_Parser *)local_1b8,(C_MemoryAllocator *)local_238);
        local_40 = true;
        pCVar13 = C_global_scope((C_Parser *)local_1b8);
        pCVar14 = C_tokenize_buffer((C_Parser *)local_1b8,local_250.buf);
        if (pCVar14 == (C_Token *)0x0) {
LAB_00120c82:
          local_26c.status = -1;
          bVar5 = 1;
        }
        else {
          C_convert_pp_tokens((C_Parser *)local_1b8,pCVar14);
          pCVar15 = C_parse(pCVar13,(C_Parser *)local_1b8,pCVar14);
          if (pCVar15 == (C_Obj *)0x0) goto LAB_00120c82;
          pCVar14 = C_tokenize_buffer((C_Parser *)local_1b8,local_1e8.buf);
          if (pCVar14 == (C_Token *)0x0) goto LAB_00120c82;
          C_convert_pp_tokens((C_Parser *)local_1b8,pCVar14);
          node = C_parse_compound_statement(pCVar13,(C_Parser *)local_1b8,pCVar14);
          if (node == (C_Node *)0x0) goto LAB_00120c82;
          walk_node(fn->api,&local_26c,node);
          bVar5 = (byte)((uint)local_26c.status >> 0x1f);
        }
        if ((local_48 != (char *)0x0 & bVar5) == 1) {
          (*fn->api->error_message)(fn->api->context,local_48);
        }
        C_parser_destroy((C_Parser *)local_1b8);
        (*(code *)local_238._40_8_)(CONCAT44(local_238._4_4_,local_238._0_4_));
        raviX_buffer_free(&local_250);
        iVar26 = -1;
        if (local_26c.status == 0) {
          raviX_buffer_add_string(mb,local_1e8.buf);
          raviX_buffer_free(&local_1e8);
          iVar26 = 0;
        }
        goto LAB_001212fa;
      case '_':
        pLVar8 = fn->proc->linearizer;
        raviX_buffer_init(&local_250,0x400);
        raviX_buffer_add_string
                  (&local_250,
                   "typedef long long int64_t;\ntypedef double lua_Number;\ntypedef int64_t lua_Integer;\ntypedef struct {\n   union { lua_Integer i; lua_Number n; } value_;\n} TValue;\nstatic lua_Integer ivalue(const TValue *v) { return 0; }\nstatic void setivalue(TValue *v, lua_Integer i) {}\nstatic lua_Number  fvalue(const TValue *v) { return 0.0; }\nstatic void setfltvalue(TValue *v, lua_Number f) {}\ntypedef struct {\n   char *data;\n   unsigned int len;\n} Ravi_Arr;\nstatic Ravi_Arr *arrvalue(const TValue *v) { return (Ravi_Arr *)v; }\nstatic int ttisfulluserdata(const TValue *v) { return 0; }\nstatic int ttislightuserdata(const TValue *v) { return 0; }\nstatic int ttisstring(const TValue *v) { return 0; }\nstatic void *uvalue(const TValue *v) { return (void*)0; }\nstatic void *pvalue(const TValue *v) { return (void*)0; }\nstatic void *svalue(const TValue *v) { return (void*)0; }\nstatic void *getudatamem(const TValue *v) { return (void*)0; }\nstatic void *gco2u(const TValue *v) { return (void*)0; }\nstatic unsigned int sizeudata(const void *p) { return 0; }\nstatic unsigned int vslen(const TValue *v) { return 0; }\nstatic void settt_(TValue *v, int tt) {}\nTValue *R(int reg) { return (void*)0; }\nstatic const int LUA_TNIL = 0;\nstatic const int LUA_TBOOLEAN = 1;\nstatic const int LUA_TLIGHTUSERDATA = 2;\nstatic const int LUA_TNUMBER = 3;\nstatic const int LUA_TSTRING = 4;\nstatic const int LUA_TTABLE = 5;\nstatic const int LUA_TFUNCTION = 6;\nstatic const int LUA_TUSERDATA = 7;\nstatic const int LUA_TTHREAD = 8;\ntypedef struct {\n   char *ptr;\n   unsigned int len;\n} Ravi_StringOrUserData;\ntypedef struct {\n  lua_Integer *ptr;\n  unsigned int len;\n} Ravi_IntegerArray;\ntypedef struct {\n  lua_Number *ptr;\n  unsigned int len;\n} Ravi_NumberArray;\nint raviX__error_code;\n"
                  );
        raviX_buffer_add_string(&local_250,(pLVar8->C_declarations).buf);
        pCVar3 = fn->proc->linearizer->compiler_state->allocator;
        local_238._8_8_ = pCVar3->realloc;
        local_238._16_8_ = pCVar3->calloc;
        local_238._24_8_ = pCVar3->free;
        local_238._32_8_ = pCVar3->create_arena;
        local_238._40_8_ = pCVar3->destroy_arena;
        local_238._0_4_ = SUB84(pCVar3->arena,0);
        local_238._4_4_ = (undefined4)((ulong)pCVar3->arena >> 0x20);
        uVar12 = (*(code *)local_238._32_8_)(0,0);
        local_238._0_4_ = (undefined4)uVar12;
        local_238._4_4_ = (undefined4)((ulong)uVar12 >> 0x20);
        C_parser_init((C_Parser *)local_1b8,(C_MemoryAllocator *)local_238);
        pCVar13 = C_global_scope((C_Parser *)local_1b8);
        pCVar14 = C_tokenize_buffer((C_Parser *)local_1b8,local_250.buf);
        iVar26 = -1;
        if (pCVar14 != (C_Token *)0x0) {
          C_convert_pp_tokens((C_Parser *)local_1b8,pCVar14);
          pCVar15 = C_parse(pCVar13,(C_Parser *)local_1b8,pCVar14);
          if (pCVar15 != (C_Obj *)0x0) {
            pcVar16 = (char *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
            pPVar17 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,1);
            pPVar18 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->targets,0);
            piVar19 = (int *)hashmap_get(&pCVar13->tags,
                                         *(char **)(*(long *)(*(long *)(pcVar16 + 8) + 8) + 0x10));
            if (piVar19 == (int *)0x0) {
              pvVar20 = hashmap_get(&pCVar13->vars,
                                    *(char **)(*(long *)(*(long *)(pcVar16 + 8) + 8) + 0x10));
              if ((pvVar20 == (void *)0x0) ||
                 (piVar19 = *(int **)((long)pvVar20 + 8), piVar19 == (int *)0x0)) {
                mb_00 = (TextBuffer *)(local_238 + 0x30);
                raviX_buffer_init(mb_00,0x80);
                raviX_buffer_add_fstring
                          (mb_00,"Unknown type \'%s\'",
                           *(undefined8 *)(*(long *)(*(long *)(pcVar16 + 8) + 8) + 0x10));
                (*fn->api->error_message)(fn->api->context,(char *)local_238._48_8_);
                raviX_buffer_free(mb_00);
                goto LAB_001212da;
              }
            }
            if (*piVar19 == 0xe) {
              piVar19 = piVar19 + 0x12;
              piVar4 = (int *)0x0;
              do {
                piVar29 = piVar4;
                piVar19 = *(int **)piVar19;
                piVar4 = piVar19;
              } while (piVar19 != (int *)0x0);
              if ((**(int **)(piVar29 + 2) != 0xc) || ((*(int **)(piVar29 + 2))[0xc] != 0))
              goto LAB_0012115d;
            }
            else {
LAB_0012115d:
              piVar29 = (int *)0x0;
            }
            local_268 = pcVar16;
            raviX_buffer_add_string(mb,"{\n");
            raviX_buffer_add_string(mb,"  TValue *raviX__elements = ");
            iVar26 = 0;
            emit_reg_accessor(fn,pPVar17,0);
            raviX_buffer_add_string(mb,";\n");
            raviX_buffer_add_string(mb,"  TValue *raviX__target = ");
            emit_reg_accessor(fn,pPVar18,0);
            raviX_buffer_add_string(mb,";\n");
            raviX_buffer_add_string(mb,"  if (ttisinteger(raviX__elements)) {\n");
            raviX_buffer_add_string(mb,"   lua_Integer n = ivalue(raviX__elements);\n");
            raviX_buffer_add_fstring(mb,"   size_t raviX__size = ");
            uVar12 = *(undefined8 *)(*(long *)(*(long *)(local_268 + 8) + 8) + 0x10);
            raviX_buffer_add_fstring(mb,"sizeof(%s)",uVar12);
            if (piVar29 != (int *)0x0) {
              raviX_buffer_add_fstring
                        (mb," + (sizeof ((%s){0}).%.*s[0])",uVar12,
                         (ulong)*(uint *)(*(long *)(piVar29 + 6) + 0x38),
                         *(undefined8 *)(*(long *)(piVar29 + 6) + 0x30));
            }
            raviX_buffer_add_fstring(mb,"* n;\n");
            raviX_buffer_add_fstring(mb,"   Udata *u = luaS_newudata(L, raviX__size);\n");
            raviX_buffer_add_string(mb,"   setuvalue(L, raviX__target, u);\n");
            raviX_buffer_add_string(mb,"  }\n");
            raviX_buffer_add_string(mb,"  else {\n");
            raviX_buffer_add_fstring(mb,"   raviX__error_code = %d;\n",0x10);
            raviX_buffer_add_string(mb,"   goto Lraise_error;\n");
            raviX_buffer_add_string(mb,"  }\n");
            raviX_buffer_add_string(mb,"}\n");
          }
        }
LAB_001212da:
        C_parser_destroy((C_Parser *)local_1b8);
        (*(code *)local_238._40_8_)(CONCAT44(local_238._4_4_,local_238._0_4_));
        raviX_buffer_free(&local_250);
LAB_001212fa:
        if (iVar26 != 0) {
          return -1;
        }
        goto LAB_001216b8;
      default:
        output_instructions_cold_1();
        return -1;
      }
      pPVar17 = (Pseudo *)raviX_ptrlist_first((PtrList *)insn->targets);
      raviX_buffer_add_string(mb,"{\n");
      raviX_buffer_add_string(mb," TValue *ra = ");
      emit_reg_accessor(fn,pPVar17,0);
      raviX_buffer_add_string(mb,";\n TValue *rb = ");
      pPVar18 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,0);
      emit_reg_accessor(fn,pPVar18,1);
      raviX_buffer_add_string(mb,";\n TValue *rc = ");
      pPVar18 = (Pseudo *)raviX_ptrlist_nth_entry((PtrList *)insn->operands,1);
      emit_reg_accessor(fn,pPVar18,2);
      raviX_buffer_add_fstring(mb,";\n luaO_arith(L, %d, rb, rc, ra);\n",uVar12);
      raviX_buffer_add_string(mb,"base = ci->u.l.base;\n");
      if ((*(uint *)pPVar17 & 0xf) - 1 < 3) {
        raviX_buffer_add_string(mb," ");
        emit_varname(fn,pPVar17);
        raviX_buffer_add_string(mb," = ");
        pcVar27 = " bvalue(ra);\n";
        if ((*(uint *)pPVar17 & 0xf) == 2) {
          pcVar27 = " ivalue(ra);\n";
        }
        pcVar16 = " fltvalue(ra);\n";
        if ((*(uint *)pPVar17 & 0xf) != 1) {
          pcVar16 = pcVar27;
        }
LAB_0012169c:
        raviX_buffer_add_string(mb,pcVar16);
      }
LAB_001216a4:
      raviX_buffer_add_string(mb,"}\n");
LAB_001216b8:
      insn = (Instruction *)raviX_ptrlist_iter_next(&local_1d0);
    } while (insn != (Instruction *)0x0);
  }
  return 0;
}

Assistant:

static int output_instructions(Function *fn, InstructionList *list)
{
	Instruction *insn;
	int rc = 0;
	FOR_EACH_PTR(list, Instruction, insn)
	{
		rc = output_instruction(fn, insn);
		if (rc != 0)
			break;
	}
	END_FOR_EACH_PTR(insn)
	return rc;
}